

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boards.cpp
# Opt level: O0

bool __thiscall Boards::Put(Boards *this,int x,int y,int turn)

{
  bool bVar1;
  reference this_00;
  reference pvVar2;
  bool local_25;
  bool ret;
  int turn_local;
  int y_local;
  int x_local;
  Boards *this_local;
  
  this_00 = std::array<std::array<int,_16UL>,_16UL>::operator[](&this->board,(long)x);
  pvVar2 = std::array<int,_16UL>::operator[](this_00,(long)y);
  if (*pvVar2 == 0) {
    local_25 = isPutable(this,x,y,1,0,turn);
    if (local_25) {
      Reverse(this,x,y,1,0,turn);
    }
    bVar1 = isPutable(this,x,y,0,1,turn);
    if (bVar1) {
      Reverse(this,x,y,0,1,turn);
      local_25 = true;
    }
    bVar1 = isPutable(this,x,y,-1,0,turn);
    if (bVar1) {
      Reverse(this,x,y,-1,0,turn);
      local_25 = true;
    }
    bVar1 = isPutable(this,x,y,0,-1,turn);
    if (bVar1) {
      Reverse(this,x,y,0,-1,turn);
      local_25 = true;
    }
    bVar1 = isPutable(this,x,y,1,1,turn);
    if (bVar1) {
      Reverse(this,x,y,1,1,turn);
      local_25 = true;
    }
    bVar1 = isPutable(this,x,y,-1,-1,turn);
    if (bVar1) {
      Reverse(this,x,y,-1,-1,turn);
      local_25 = true;
    }
    bVar1 = isPutable(this,x,y,1,-1,turn);
    if (bVar1) {
      Reverse(this,x,y,1,-1,turn);
      local_25 = true;
    }
    bVar1 = isPutable(this,x,y,-1,1,turn);
    if (bVar1) {
      Reverse(this,x,y,-1,1,turn);
      local_25 = true;
    }
    this_local._7_1_ = local_25;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Boards::Put(int x, int y, int turn){
	bool ret = false;
	if(board[x][y] != 0) return ret;//1 white -1 black
	if(isPutable(x, y, 1, 0, turn)){
		Reverse(x, y, 1, 0, turn);
		ret = true;
	}    //右
	if(isPutable(x, y, 0, 1, turn)){
		Reverse(x, y, 0, 1, turn);
		ret = true;
	}    //下
	if(isPutable(x, y, -1, 0, turn)){
		Reverse(x, y, -1, 0, turn);
		ret = true;
	}    //左
	if(isPutable(x, y, 0, -1, turn)){
		Reverse(x, y, 0, -1, turn);
		ret = true;
	}    //上
	if(isPutable(x, y, 1, 1, turn)){
		Reverse(x, y, 1, 1, turn);
		ret = true;
	}    //右下
	if(isPutable(x, y, -1, -1, turn)){
		Reverse(x, y, -1, -1, turn);
		ret = true;
	}    //左上
	if(isPutable(x, y, 1, -1, turn)){
		Reverse(x, y, 1, -1, turn);
		ret = true;
	}    //右上
	if(isPutable(x, y, -1, 1, turn)){
		Reverse(x, y, -1, 1, turn);
		ret = true;
	}    //左下

	return ret;
}